

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

Maybe<kj::Array<char>_> *
kj::parse::Many_<kj::parse::CharGroup_,_true>::Impl<capnp::compiler::Lexer::ParserInput,_char>::
apply(Maybe<kj::Array<char>_> *__return_storage_ptr__,CharGroup_ *subParser,ParserInput *input)

{
  byte bVar1;
  char *pcVar2;
  char *pcVar3;
  byte *pbVar4;
  size_t newSize;
  byte *pbVar5;
  Vector<char> local_58;
  
  local_58.builder.ptr = (char *)0x0;
  local_58.builder.pos = (RemoveConst<char> *)0x0;
  local_58.builder.endPtr = (char *)0x0;
  local_58.builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  pbVar5 = (byte *)(input->super_IteratorInput<char,_const_char_*>).pos;
  if (pbVar5 != (byte *)(input->super_IteratorInput<char,_const_char_*>).end) {
    do {
      bVar1 = *pbVar5;
      if ((subParser->bits[bVar1 >> 6] >> ((ulong)bVar1 & 0x3f) & 1) == 0) {
        pbVar4 = (byte *)(input->super_IteratorInput<char,_const_char_*>).best;
        if (pbVar4 < pbVar5) {
          pbVar4 = pbVar5;
        }
        (input->super_IteratorInput<char,_const_char_*>).best = (char *)pbVar4;
        break;
      }
      pbVar5 = pbVar5 + 1;
      (input->super_IteratorInput<char,_const_char_*>).pos = (char *)pbVar5;
      if (local_58.builder.pos == local_58.builder.endPtr) {
        newSize = ((long)local_58.builder.pos - (long)local_58.builder.ptr) * 2;
        if (local_58.builder.pos == local_58.builder.ptr) {
          newSize = 4;
        }
        Vector<char>::setCapacity(&local_58,newSize);
      }
      *local_58.builder.pos = bVar1;
      local_58.builder.pos = local_58.builder.pos + 1;
      pbVar4 = (byte *)(input->super_IteratorInput<char,_const_char_*>).best;
      if (pbVar4 < pbVar5) {
        pbVar4 = pbVar5;
      }
      pbVar5 = (byte *)(input->super_IteratorInput<char,_const_char_*>).pos;
      (input->super_IteratorInput<char,_const_char_*>).best = (char *)pbVar4;
    } while (pbVar5 != (byte *)(input->super_IteratorInput<char,_const_char_*>).end);
  }
  pcVar3 = local_58.builder.endPtr;
  pcVar2 = local_58.builder.ptr;
  if ((long)local_58.builder.pos - (long)local_58.builder.ptr == 0) {
    (__return_storage_ptr__->ptr).isSet = false;
    if ((byte *)local_58.builder.ptr != (byte *)0x0) {
      local_58.builder.ptr = (char *)0x0;
      local_58.builder.pos = (RemoveConst<char> *)0x0;
      local_58.builder.endPtr = (char *)0x0;
      (**(local_58.builder.disposer)->_vptr_ArrayDisposer)
                (local_58.builder.disposer,pcVar2,1,0,(long)pcVar3 - (long)pcVar2,0);
    }
  }
  else {
    if (local_58.builder.pos != local_58.builder.endPtr) {
      Vector<char>::setCapacity(&local_58,(long)local_58.builder.pos - (long)local_58.builder.ptr);
    }
    (__return_storage_ptr__->ptr).isSet = true;
    (__return_storage_ptr__->ptr).field_1.value.ptr = local_58.builder.ptr;
    (__return_storage_ptr__->ptr).field_1.value.size_ =
         (long)local_58.builder.pos - (long)local_58.builder.ptr;
    (__return_storage_ptr__->ptr).field_1.value.disposer = local_58.builder.disposer;
  }
  return __return_storage_ptr__;
}

Assistant:

static Maybe<Array<Output>> apply(const SubParser& subParser, Input& input) {
    typedef Vector<OutputType<SubParser, Input>> Results;
    Results results;

    while (!input.atEnd()) {
      Input subInput(input);

      KJ_IF_SOME(subResult, subParser(subInput)) {
        subInput.advanceParent();
        results.add(kj::mv(subResult));
      } else {
        break;
      }
    }